

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onepass.cc
# Opt level: O1

bool __thiscall re2::Prog::IsOnePass(Prog *this)

{
  Inst *this_00;
  byte bVar1;
  uchar *p;
  undefined1 auVar2 [16];
  anon_struct_4_3_47ed7b4f_for_anon_union_4_5_a3ff96c3_for_Inst_2_3 aVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  anon_struct_4_3_47ed7b4f_for_anon_union_4_5_a3ff96c3_for_Inst_2_3 aVar10;
  _Tuple_impl<1UL,_re2::PODArray<unsigned_char>::Deleter> _Var11;
  long lVar12;
  InstCond *p_00;
  int *__s;
  uchar *puVar13;
  char cVar14;
  _Head_base<0UL,_int_*,_false> _Var15;
  long lVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  uint *puVar22;
  bool bVar23;
  vector<unsigned_char,_std::allocator<unsigned_char>_> nodes;
  Instq workq;
  Instq tovisit;
  uint local_27c;
  int local_26c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_258;
  size_type local_238;
  int local_22c;
  size_t local_228;
  size_type local_220;
  long local_218;
  long local_210;
  int *local_208;
  SparseSetT<void> local_200;
  SparseSetT<void> local_1d8;
  LogMessage local_1b0;
  
  if (this->did_onepass_ == true) {
    bVar23 = (this->onepass_nodes_).ptr_._M_t.
             super___uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_re2::PODArray<unsigned_char>::Deleter>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != (uchar *)0x0;
  }
  else {
    this->did_onepass_ = true;
    if ((this->start_ != 0) && ((long)this->inst_count_[2] < 0xfde6)) {
      local_218 = (long)this->inst_count_[2] + 2;
      lVar16 = this->dfa_mem_;
      lVar12 = lVar16 + 3;
      if (-1 < lVar16) {
        lVar12 = lVar16;
      }
      local_22c = this->bytemap_range_ * 4 + 4;
      local_238 = (size_type)local_22c;
      auVar2._8_8_ = lVar12 >> 0x3f;
      auVar2._0_8_ = lVar12 >> 2;
      if (local_218 <= SUB168(auVar2 / SEXT816((long)local_238),0)) {
        local_220 = (size_type)
                    (this->inst_count_[3] + this->inst_count_[4] + this->inst_count_[6] + 1);
        p_00 = __gnu_cxx::new_allocator<re2::InstCond>::allocate
                         ((new_allocator<re2::InstCond> *)&local_1b0,local_220,(void *)0x0);
        iVar8 = this->size_;
        __s = __gnu_cxx::new_allocator<int>::allocate
                        ((new_allocator<int> *)&local_1b0,(long)iVar8,(void *)0x0);
        local_228 = (long)iVar8 * 4;
        memset(__s,0xff,local_228);
        local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (uchar *)0x0;
        local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        SparseSetT<void>::SparseSetT(&local_1d8,iVar8);
        SparseSetT<void>::SparseSetT(&local_200,iVar8);
        AddQ(&local_1d8,this->start_);
        __s[this->start_] = 0;
        local_1b0.flushed_ = false;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
                  (&local_258,
                   (iterator)
                   local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish,local_238,&local_1b0.flushed_);
        if (local_1d8.size_ == 0) {
          bVar23 = true;
          iVar8 = 1;
        }
        else {
          iVar8 = 1;
          _Var15._M_head_impl =
               local_1d8.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
               _M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl;
          do {
            iVar7 = *_Var15._M_head_impl;
            local_210 = (long)__s[iVar7] * local_238;
            puVar22 = (uint *)(local_258.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + local_210);
            if (0 < this->bytemap_range_) {
              lVar16 = 0;
              do {
                puVar22[lVar16 + 1] = 0x30;
                lVar16 = lVar16 + 1;
              } while (lVar16 < this->bytemap_range_);
            }
            *puVar22 = 0x30;
            local_200.size_ = 0;
            p_00->id = iVar7;
            bVar23 = false;
            p_00->cond = 0;
            local_26c = 1;
            local_208 = _Var15._M_head_impl;
            do {
              uVar19 = p_00[(long)local_26c + -1].id;
              local_27c = p_00[(long)local_26c + -1].cond;
              local_26c = local_26c + -1;
              do {
                this_00 = (this->inst_).ptr_._M_t.
                          super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                          .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl +
                          (int)uVar19;
                uVar6 = this_00->out_opcode_;
                cVar14 = '\0';
                switch(uVar6 & 7) {
                case 0:
                  LogMessage::LogMessage
                            (&local_1b0,
                             "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/re2-src/re2/onepass.cc"
                             ,0x1bf);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (&local_1b0.str_.super_basic_ostream<char,_std::char_traits<char>_>,
                             "unhandled opcode: ",0x12);
                  std::ostream::operator<<(&local_1b0.str_,this_00->out_opcode_ & 7);
                  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
                case 1:
                  if ((uVar6 & 8) != 0) {
                    __assert_fail("!ip->last()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/re2-src/re2/onepass.cc"
                                  ,0x1c5,"bool re2::Prog::IsOnePass()");
                  }
                  bVar4 = AddQ(&local_200,uVar19 + 1);
LAB_00235ea4:
                  if (bVar4 != false) {
                    uVar19 = uVar19 + 1;
                  }
                  cVar14 = (bVar4 ^ 1U) * '\x02' + '\n';
                  break;
                case 2:
                  iVar20 = __s[uVar6 >> 4];
                  iVar7 = iVar8;
                  if (__s[uVar6 >> 4] == -1) {
                    cVar14 = '\f';
                    if (iVar8 < (int)local_218) {
                      AddQ(&local_1d8,uVar6 >> 4);
                      __s[this_00->out_opcode_ >> 4] = iVar8;
                      local_1b0.flushed_ = false;
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
                                (&local_258,
                                 (iterator)
                                 local_258.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,local_238,
                                 &local_1b0.flushed_);
                      iVar7 = iVar8 + 1;
                      puVar22 = (uint *)(local_258.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start + local_210);
                      iVar20 = iVar8;
                      goto LAB_00235d89;
                    }
                  }
                  else {
LAB_00235d89:
                    if ((this_00->out_opcode_ & 7) != 2) {
LAB_0023613f:
                      __assert_fail("(opcode()) == (kInstByteRange)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/re2-src/re2/prog.h"
                                    ,0x57,"int re2::Prog::Inst::lo()");
                    }
                    if ((this_00->out_opcode_ & 7) != 2) {
LAB_0023611b:
                      __assert_fail("(opcode()) == (kInstByteRange)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/re2-src/re2/prog.h"
                                    ,0x58,"int re2::Prog::Inst::hi()");
                    }
                    uVar9 = (uint)(this_00->field_1).field_3.lo_;
                    uVar21 = iVar20 << 0x10 | local_27c;
                    uVar6 = uVar21;
                    if (bVar23) {
                      uVar6 = uVar21 | 0x40;
                    }
                    while ((int)uVar9 <= (int)(uint)(this_00->field_1).field_3.hi_) {
                      bVar5 = this->bytemap_[(int)uVar9];
                      iVar8 = uVar9 - 1;
                      lVar16 = (long)(int)uVar9;
                      do {
                        if (lVar16 == 0xff) {
                          iVar8 = 0xff;
                          break;
                        }
                        iVar8 = iVar8 + 1;
                        lVar12 = lVar16 + 1;
                        lVar16 = lVar16 + 1;
                      } while (this->bytemap_[lVar12] == bVar5);
                      if ((~puVar22[(ulong)bVar5 + 1] & 0x30) == 0) {
                        puVar22[(ulong)bVar5 + 1] = uVar6;
LAB_00235e21:
                        cVar14 = '\0';
                        bVar4 = true;
                      }
                      else {
                        if (puVar22[(ulong)bVar5 + 1] == uVar6) goto LAB_00235e21;
                        cVar14 = '\f';
                        bVar4 = false;
                      }
                      if (!bVar4) goto LAB_00235ebf;
                      uVar9 = iVar8 + 1;
                      if ((this_00->out_opcode_ & 7) != 2) goto LAB_0023611b;
                    }
                    cVar14 = '\r';
LAB_00235ebf:
                    if (cVar14 == '\r') {
                      iVar8 = Inst::foldcase(this_00);
                      if (iVar8 != 0) {
                        if ((this_00->out_opcode_ & 7) != 2) goto LAB_0023613f;
                        aVar10.lo_ = 'a';
                        aVar10.hi_ = '\0';
                        aVar10.hint_foldcase_ = 0;
                        aVar3 = (this_00->field_1).field_3;
                        if ((this_00->field_1).field_3.lo_ < 0x62) {
                          aVar3 = aVar10;
                        }
                        bVar5 = (this_00->field_1).field_3.hi_;
                        if (0x79 < bVar5) {
                          bVar5 = 0x7a;
                        }
                        if (aVar3.lo_ <= bVar5) {
                          iVar8 = ((uint)aVar3 & 0xff) - 0x20;
                          if (bVar23) {
                            uVar21 = uVar21 | 0x40;
                          }
                          do {
                            bVar1 = this->bytemap_[iVar8];
                            iVar20 = 0xff;
                            if (0xff < iVar8) {
                              iVar20 = iVar8;
                            }
                            iVar17 = iVar8 + -1;
                            lVar16 = (long)iVar8;
                            do {
                              iVar18 = iVar20;
                              if (0xfe < lVar16) break;
                              iVar17 = iVar17 + 1;
                              lVar12 = lVar16 + 1;
                              lVar16 = lVar16 + 1;
                              iVar18 = iVar17;
                            } while (this->bytemap_[lVar12] == bVar1);
                            if ((~puVar22[(ulong)bVar1 + 1] & 0x30) == 0) {
                              puVar22[(ulong)bVar1 + 1] = uVar21;
LAB_00235f7c:
                              cVar14 = '\0';
                              bVar4 = true;
                            }
                            else {
                              if (puVar22[(ulong)bVar1 + 1] == uVar21) goto LAB_00235f7c;
                              cVar14 = '\f';
                              bVar4 = false;
                            }
                            if (!bVar4) goto LAB_00235f9b;
                            iVar8 = iVar18 + 1;
                          } while (iVar18 < (int)(bVar5 - 0x20));
                        }
                        cVar14 = '\x12';
LAB_00235f9b:
                        if (cVar14 != '\x12') goto LAB_00235fe3;
                      }
                      cVar14 = '\v';
                      if ((this_00->out_opcode_ & 8) == 0) {
                        bVar4 = AddQ(&local_200,uVar19 + 1);
                        if (bVar4) {
                          uVar19 = uVar19 + 1;
                        }
                        cVar14 = !bVar4 * '\x02' + '\n';
                      }
                    }
                  }
LAB_00235fe3:
                  iVar8 = iVar7;
                  if (cVar14 == '\v') {
                    cVar14 = '\0';
                  }
                  break;
                default:
                  if ((uVar6 & 8) == 0) {
                    bVar4 = AddQ(&local_200,uVar19 + 1);
                    cVar14 = '\f';
                    if (!bVar4) break;
                    lVar16 = (long)local_26c;
                    p_00[lVar16].id = uVar19 + 1;
                    local_26c = local_26c + 1;
                    p_00[lVar16].cond = local_27c;
                  }
                  uVar6 = this_00->out_opcode_ & 7;
                  if ((uVar6 == 3) && ((int)(this_00->field_1).field_3 < 10)) {
                    local_27c = local_27c | 0x20 << ((this_00->field_1).field_3.lo_ & 0x1f);
                  }
                  if (uVar6 == 4) {
                    local_27c = local_27c | (this_00->field_1).out1_;
                  }
                  bVar4 = AddQ(&local_200,this_00->out_opcode_ >> 4);
                  cVar14 = '\f';
                  if (bVar4) {
                    uVar19 = this_00->out_opcode_ >> 4;
                    cVar14 = '\n';
                  }
                  break;
                case 5:
                  if (bVar23) {
                    cVar14 = '\f';
                  }
                  else {
                    *puVar22 = local_27c;
                    bVar23 = true;
                    cVar14 = '\0';
                    if ((this_00->out_opcode_ & 8) == 0) {
                      bVar4 = AddQ(&local_200,uVar19 + 1);
                      goto LAB_00235ea4;
                    }
                  }
                  break;
                case 7:
                  break;
                }
              } while (cVar14 == '\n');
              if (cVar14 != '\0') goto LAB_00236009;
            } while (0 < local_26c);
            cVar14 = '\0';
LAB_00236009:
            if (cVar14 != '\0') goto LAB_00236040;
            _Var15._M_head_impl = local_208 + 1;
          } while (_Var15._M_head_impl !=
                   local_1d8.dense_.ptr_._M_t.
                   super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                   super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl + local_1d8.size_);
          cVar14 = '\x02';
LAB_00236040:
          bVar23 = cVar14 == '\x02';
        }
        if (bVar23 != false) {
          _Var11.super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>._M_head_impl.
          len_ = (_Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>)(iVar8 * local_22c);
          this->dfa_mem_ =
               this->dfa_mem_ -
               (long)(int)_Var11.super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>
                          ._M_head_impl.len_;
          if ((int)_Var11.super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>.
                   _M_head_impl.len_ < 0) {
            std::__throw_bad_alloc();
          }
          puVar13 = (uchar *)operator_new((ulong)(uint)_Var11.
                                                  super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>
                                                  ._M_head_impl.len_);
          p = (this->onepass_nodes_).ptr_._M_t.
              super___uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter>._M_t.
              super__Tuple_impl<0UL,_unsigned_char_*,_re2::PODArray<unsigned_char>::Deleter>.
              super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
          (this->onepass_nodes_).ptr_._M_t.
          super___uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_re2::PODArray<unsigned_char>::Deleter>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = puVar13;
          if (p != (uchar *)0x0) {
            operator_delete(p,(long)(int)(this->onepass_nodes_).ptr_._M_t.
                                         super___uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_unsigned_char_*,_re2::PODArray<unsigned_char>::Deleter>
                                         .
                                         super__Tuple_impl<1UL,_re2::PODArray<unsigned_char>::Deleter>
                                         .
                                         super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>
                           );
          }
          (this->onepass_nodes_).ptr_._M_t.
          super___uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_re2::PODArray<unsigned_char>::Deleter>.
          super__Tuple_impl<1UL,_re2::PODArray<unsigned_char>::Deleter>.
          super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false> =
               _Var11.super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>.
               _M_head_impl.len_;
          memmove((this->onepass_nodes_).ptr_._M_t.
                  super___uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter>._M_t.
                  super__Tuple_impl<0UL,_unsigned_char_*,_re2::PODArray<unsigned_char>::Deleter>.
                  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                  local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start,
                  (long)(int)_Var11.
                             super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>.
                             _M_head_impl.len_);
        }
        SparseSetT<void>::~SparseSetT(&local_200);
        SparseSetT<void>::~SparseSetT(&local_1d8);
        if (local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_258.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_258.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_258.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (__s != (int *)0x0) {
          operator_delete(__s,local_228);
        }
        if (p_00 == (InstCond *)0x0) {
          return bVar23;
        }
        operator_delete(p_00,local_220 << 3);
        return bVar23;
      }
    }
    bVar23 = false;
  }
  return bVar23;
}

Assistant:

bool Prog::IsOnePass() {
  if (did_onepass_)
    return onepass_nodes_.data() != NULL;
  did_onepass_ = true;

  if (start() == 0)  // no match
    return false;

  // Steal memory for the one-pass NFA from the overall DFA budget.
  // Willing to use at most 1/4 of the DFA budget (heuristic).
  // Limit max node count to 65000 as a conservative estimate to
  // avoid overflowing 16-bit node index in encoding.
  int maxnodes = 2 + inst_count(kInstByteRange);
  int statesize = sizeof(OneState) + bytemap_range()*sizeof(uint32_t);
  if (maxnodes >= 65000 || dfa_mem_ / 4 / statesize < maxnodes)
    return false;

  // Flood the graph starting at the start state, and check
  // that in each reachable state, each possible byte leads
  // to a unique next state.
  int stacksize = inst_count(kInstCapture) +
                  inst_count(kInstEmptyWidth) +
                  inst_count(kInstNop) + 1;  // + 1 for start inst
  PODArray<InstCond> stack(stacksize);

  int size = this->size();
  PODArray<int> nodebyid(size);  // indexed by ip
  memset(nodebyid.data(), 0xFF, size*sizeof nodebyid[0]);

  // Originally, nodes was a uint8_t[maxnodes*statesize], but that was
  // unnecessarily optimistic: why allocate a large amount of memory
  // upfront for a large program when it is unlikely to be one-pass?
  std::vector<uint8_t> nodes;

  Instq tovisit(size), workq(size);
  AddQ(&tovisit, start());
  nodebyid[start()] = 0;
  int nalloc = 1;
  nodes.insert(nodes.end(), statesize, 0);
  for (Instq::iterator it = tovisit.begin(); it != tovisit.end(); ++it) {
    int id = *it;
    int nodeindex = nodebyid[id];
    OneState* node = IndexToNode(nodes.data(), statesize, nodeindex);

    // Flood graph using manual stack, filling in actions as found.
    // Default is none.
    for (int b = 0; b < bytemap_range_; b++)
      node->action[b] = kImpossible;
    node->matchcond = kImpossible;

    workq.clear();
    bool matched = false;
    int nstack = 0;
    stack[nstack].id = id;
    stack[nstack++].cond = 0;
    while (nstack > 0) {
      int id = stack[--nstack].id;
      uint32_t cond = stack[nstack].cond;

    Loop:
      Prog::Inst* ip = inst(id);
      switch (ip->opcode()) {
        default:
          LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
          break;

        case kInstAltMatch:
          // TODO(rsc): Ignoring kInstAltMatch optimization.
          // Should implement it in this engine, but it's subtle.
          DCHECK(!ip->last());
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;

        case kInstByteRange: {
          int nextindex = nodebyid[ip->out()];
          if (nextindex == -1) {
            if (nalloc >= maxnodes) {
              if (ExtraDebug)
                LOG(ERROR) << StringPrintf(
                    "Not OnePass: hit node limit %d >= %d", nalloc, maxnodes);
              goto fail;
            }
            nextindex = nalloc;
            AddQ(&tovisit, ip->out());
            nodebyid[ip->out()] = nalloc;
            nalloc++;
            nodes.insert(nodes.end(), statesize, 0);
            // Update node because it might have been invalidated.
            node = IndexToNode(nodes.data(), statesize, nodeindex);
          }
          for (int c = ip->lo(); c <= ip->hi(); c++) {
            int b = bytemap_[c];
            // Skip any bytes immediately after c that are also in b.
            while (c < 256-1 && bytemap_[c+1] == b)
              c++;
            uint32_t act = node->action[b];
            uint32_t newact = (nextindex << kIndexShift) | cond;
            if (matched)
              newact |= kMatchWins;
            if ((act & kImpossible) == kImpossible) {
              node->action[b] = newact;
            } else if (act != newact) {
              if (ExtraDebug)
                LOG(ERROR) << StringPrintf(
                    "Not OnePass: conflict on byte %#x at state %d", c, *it);
              goto fail;
            }
          }
          if (ip->foldcase()) {
            Rune lo = std::max<Rune>(ip->lo(), 'a') + 'A' - 'a';
            Rune hi = std::min<Rune>(ip->hi(), 'z') + 'A' - 'a';
            for (int c = lo; c <= hi; c++) {
              int b = bytemap_[c];
              // Skip any bytes immediately after c that are also in b.
              while (c < 256-1 && bytemap_[c+1] == b)
                c++;
              uint32_t act = node->action[b];
              uint32_t newact = (nextindex << kIndexShift) | cond;
              if (matched)
                newact |= kMatchWins;
              if ((act & kImpossible) == kImpossible) {
                node->action[b] = newact;
              } else if (act != newact) {
                if (ExtraDebug)
                  LOG(ERROR) << StringPrintf(
                      "Not OnePass: conflict on byte %#x at state %d", c, *it);
                goto fail;
              }
            }
          }

          if (ip->last())
            break;
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;
        }

        case kInstCapture:
        case kInstEmptyWidth:
        case kInstNop:
          if (!ip->last()) {
            // If already on work queue, (1) is violated: bail out.
            if (!AddQ(&workq, id+1))
              goto fail;
            stack[nstack].id = id+1;
            stack[nstack++].cond = cond;
          }

          if (ip->opcode() == kInstCapture && ip->cap() < kMaxCap)
            cond |= (1 << kCapShift) << ip->cap();
          if (ip->opcode() == kInstEmptyWidth)
            cond |= ip->empty();

          // kInstCapture and kInstNop always proceed to ip->out().
          // kInstEmptyWidth only sometimes proceeds to ip->out(),
          // but as a conservative approximation we assume it always does.
          // We could be a little more precise by looking at what c
          // is, but that seems like overkill.

          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, ip->out())) {
            if (ExtraDebug)
              LOG(ERROR) << StringPrintf(
                  "Not OnePass: multiple paths %d -> %d", *it, ip->out());
            goto fail;
          }
          id = ip->out();
          goto Loop;

        case kInstMatch:
          if (matched) {
            // (3) is violated
            if (ExtraDebug)
              LOG(ERROR) << StringPrintf(
                  "Not OnePass: multiple matches from %d", *it);
            goto fail;
          }
          matched = true;
          node->matchcond = cond;

          if (ip->last())
            break;
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;

        case kInstFail:
          break;
      }
    }
  }

  if (ExtraDebug) {  // For debugging, dump one-pass NFA to LOG(ERROR).
    LOG(ERROR) << "bytemap:\n" << DumpByteMap();
    LOG(ERROR) << "prog:\n" << Dump();

    std::map<int, int> idmap;
    for (int i = 0; i < size; i++)
      if (nodebyid[i] != -1)
        idmap[nodebyid[i]] = i;

    std::string dump;
    for (Instq::iterator it = tovisit.begin(); it != tovisit.end(); ++it) {
      int id = *it;
      int nodeindex = nodebyid[id];
      if (nodeindex == -1)
        continue;
      OneState* node = IndexToNode(nodes.data(), statesize, nodeindex);
      dump += StringPrintf("node %d id=%d: matchcond=%#x\n",
                           nodeindex, id, node->matchcond);
      for (int i = 0; i < bytemap_range_; i++) {
        if ((node->action[i] & kImpossible) == kImpossible)
          continue;
        dump += StringPrintf("  %d cond %#x -> %d id=%d\n",
                             i, node->action[i] & 0xFFFF,
                             node->action[i] >> kIndexShift,
                             idmap[node->action[i] >> kIndexShift]);
      }
    }
    LOG(ERROR) << "nodes:\n" << dump;
  }

  dfa_mem_ -= nalloc*statesize;
  onepass_nodes_ = PODArray<uint8_t>(nalloc*statesize);
  memmove(onepass_nodes_.data(), nodes.data(), nalloc*statesize);
  return true;

fail:
  return false;
}